

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

Ptr __thiscall core::image::load_png_file(image *this,string *filename)

{
  long *plVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  FILE *__stream;
  Image<unsigned_char> *__p;
  FileException *this_00;
  int *piVar6;
  char *msg;
  Exception *this_01;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  Ptr PVar9;
  undefined1 local_88 [8];
  ImageHeaders headers;
  undefined1 auStack_68 [8];
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> row_pointers;
  png_infop local_40;
  png_infop png_info;
  png_structp png;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar6 = __errno_location();
    msg = strerror(*piVar6);
    util::FileException::FileException(this_00,filename,msg);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  png_info = (png_infop)0x0;
  local_40 = (png_infop)0x0;
  anon_unknown_7::load_png_headers_intern
            ((FILE *)__stream,(ImageHeaders *)local_88,(png_structp *)&png_info,&local_40);
  bVar3 = png_get_bit_depth(png_info,local_40);
  if (bVar3 < 9) {
    cVar4 = png_get_color_type(png_info,local_40);
    if (cVar4 == '\x03') {
      png_set_palette_to_rgb(png_info);
    }
    else if (bVar3 != 8 && cVar4 == '\0') {
      png_set_expand_gray_1_2_4_to_8(png_info);
    }
    headers._8_8_ = __stream;
    iVar5 = png_get_valid(png_info,local_40,0x10);
    if (iVar5 != 0) {
      png_set_tRNS_to_alpha(png_info);
    }
    png_read_update_info(png_info,local_40);
    __p = (Image<unsigned_char> *)operator_new(0x30);
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.w = 0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.h = 0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.c = 0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0014cd28;
    *(Image<unsigned_char> **)this = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
    plVar1 = *(long **)this;
    (**(code **)(*plVar1 + 0x40))(plVar1);
    *(undefined4 *)(plVar1 + 1) = local_88._0_4_;
    *(undefined4 *)((long)plVar1 + 0xc) = local_88._4_4_;
    *(int *)(plVar1 + 2) = headers.width;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar1 + 3),
               (long)(headers.width * local_88._0_4_ * local_88._4_4_));
    lVar2 = *(long *)this;
    auStack_68 = (undefined1  [8])0x0;
    row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::resize
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)auStack_68,
               (long)(int)local_88._4_4_);
    if (0 < (int)local_88._4_4_) {
      iVar5 = 0;
      uVar7 = 0;
      do {
        *(long *)((long)auStack_68 + uVar7 * 8) = *(long *)(lVar2 + 0x18) + (long)iVar5;
        uVar7 = uVar7 + 1;
        iVar5 = iVar5 + headers.width * local_88._0_4_;
      } while ((uint)local_88._4_4_ != uVar7);
    }
    png_read_image(png_info,auStack_68);
    png_destroy_read_struct(&png_info,&local_40,0);
    fclose((FILE *)headers._8_8_);
    _Var8._M_pi = extraout_RDX;
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68);
      _Var8._M_pi = extraout_RDX_00;
    }
    PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var8._M_pi;
    PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  png_destroy_read_struct(&png_info,&local_40,0);
  fclose(__stream);
  this_01 = (Exception *)__cxa_allocate_exception(0x28);
  auStack_68 = (undefined1  [8])
               &row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_68,"PNG with more than 8 bit","");
  util::Exception::Exception(this_01,(string *)auStack_68);
  __cxa_throw(this_01,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

ByteImage::Ptr
load_png_file (std::string const& filename)
{
    // TODO: use throw-safe FILE* wrapper
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    /* Read PNG header info. */
    ImageHeaders headers;
    png_structp png = nullptr;
    png_infop png_info = nullptr;
    load_png_headers_intern(fp, &headers, &png, &png_info);

    /* Check if bit depth is valid. */
    int const bit_depth = png_get_bit_depth(png, png_info);
    if (bit_depth > 8)
    {
        png_destroy_read_struct(&png, &png_info, nullptr);
        std::fclose(fp);
        throw util::Exception("PNG with more than 8 bit");
    }

    /* Apply transformations. */
    int const color_type = png_get_color_type(png, png_info);
    if (color_type == PNG_COLOR_TYPE_PALETTE)
        png_set_palette_to_rgb(png);
    if (color_type == PNG_COLOR_TYPE_GRAY && bit_depth < 8)
        png_set_expand_gray_1_2_4_to_8(png);
    if (png_get_valid(png, png_info, PNG_INFO_tRNS))
        png_set_tRNS_to_alpha(png);

    /* Update the info struct to reflect the transformations. */
    png_read_update_info(png, png_info);

    /* Create image. */
    ByteImage::Ptr image = ByteImage::create();
    image->allocate(headers.width, headers.height, headers.channels);
    ByteImage::ImageData& data = image->get_data();

    /* Setup row pointers. */
    std::vector<png_bytep> row_pointers;
    row_pointers.resize(headers.height);
    for (int i = 0; i < headers.height; ++i)
        row_pointers[i] = &data[i * headers.width * headers.channels];

    /* Read the whole PNG in memory. */
    png_read_image(png, &row_pointers[0]);

    /* Clean up. */
    png_destroy_read_struct(&png, &png_info, nullptr);
    std::fclose(fp);

    return image;
}